

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_PlayerAddFrag(FParser *this)

{
  int iVar1;
  int iVar2;
  
  if (0 < this->t_argc) {
    iVar2 = this->t_argc;
    iVar1 = T_GetPlayerNum(this->t_argv);
    if (iVar2 == 1) {
      iVar2 = (&DAT_017e5f14)[(long)iVar1 * 0xa8];
      (&DAT_017e5f14)[(long)iVar1 * 0xa8] = iVar2 + 1;
      (this->t_return).type = 1;
      (this->t_return).value.i = iVar2 + 1;
    }
    else {
      iVar2 = T_GetPlayerNum(this->t_argv + 1);
      *(int *)(&DAT_017e5ef4 + (long)iVar2 * 4 + (long)iVar1 * 0x2a0) =
           *(int *)(&DAT_017e5ef4 + (long)iVar2 * 4 + (long)iVar1 * 0x2a0) + 1;
      (this->t_return).type = 1;
      (this->t_return).value.i = *(int *)(&DAT_017e5ef4 + (long)iVar2 * 4 + (long)iVar1 * 0x2a0);
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_PlayerAddFrag()
{
	int playernum1;
	int playernum2;

	if (CheckArgs(1))
	{
		if (t_argc == 1)
		{
			playernum1 = T_GetPlayerNum(t_argv[0]);

			players[playernum1].fragcount++;

			t_return.type = svt_int;
			t_return.value.f = players[playernum1].fragcount;
		}

		else
		{
			playernum1 = T_GetPlayerNum(t_argv[0]);
			playernum2 = T_GetPlayerNum(t_argv[1]);

			players[playernum1].frags[playernum2]++;

			t_return.type = svt_int;
			t_return.value.f = players[playernum1].frags[playernum2];
		}
	}
}